

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserUpdateView.cpp
# Opt level: O1

void __thiscall UserUpdateView::display(UserUpdateView *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ModelForm<BaseUser> *this_00;
  undefined1 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  Application *this_01;
  BaseUser *pBVar8;
  char *__s;
  UserCreateUpdateForm *this_02;
  undefined4 extraout_var;
  long *plVar9;
  undefined8 *puVar10;
  Controller *pCVar11;
  View *pVVar12;
  size_type *psVar13;
  string password;
  string lastName;
  string firstName;
  string email;
  BaseUser loggedInUser;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  BaseUser local_120;
  
  this_01 = Application::getInstance();
  pBVar8 = Application::getCurrentUser(this_01);
  local_120.super_Model<BaseUser>.id = (pBVar8->super_Model<BaseUser>).id;
  local_120.super_Model<BaseUser>._vptr_Model = (_func_int **)&PTR_save_0012dc18;
  memcpy(&local_120.super_Model<BaseUser>.field_0xc,&(pBVar8->super_Model<BaseUser>).field_0xc,0xe1)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"To update a user fill in the details asked below: \n",0x33);
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_1a0._M_string_length = 0;
  local_1a0.field_2._M_local_buf[0] = '\0';
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  bVar5 = BaseUser::isAdmin(&local_120);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Email: ",7);
    Input::getEmail_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&local_160,(string *)&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
  }
  else {
    __s = BaseUser::getEmail(&local_120);
    sVar4 = local_160._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_160,0,(char *)sVar4,(ulong)__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"First name: ",0xc);
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_180,(string *)&local_200);
  paVar1 = &local_200.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Last name: ",0xb);
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Password: ",10);
  Input::getPassword_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  bVar5 = BaseUser::isAdmin(&local_120);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Should this user be an admin? (y/n): ",0x25);
    cVar6 = Input::getChar();
    bVar5 = cVar6 == 'y';
  }
  else {
    bVar5 = false;
  }
  pBVar8 = BaseUser::findByEmail(&local_160);
  if (pBVar8 == (BaseUser *)0x0) {
    std::operator+(&local_1e0,"A user with ",&local_160);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    psVar13 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_200.field_2._M_allocated_capacity = *psVar13;
      local_200.field_2._8_8_ = plVar9[3];
      local_200._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_200.field_2._M_allocated_capacity = *psVar13;
      local_200._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_200._M_string_length = plVar9[1];
    *plVar9 = (long)psVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_200._M_dataplus._M_p,local_200._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    pbVar3 = &local_1e0;
  }
  else {
    this_02 = (UserCreateUpdateForm *)operator_new(0xb0);
    UserCreateUpdateForm::UserCreateUpdateForm
              (this_02,&local_180,&local_1a0,&local_160,&local_1c0,bVar5,pBVar8);
    (this->super_UpdateView<BaseUser>).form = (ModelForm<BaseUser> *)this_02;
    bVar5 = Form::isValid((Form *)this_02);
    this_00 = (this->super_UpdateView<BaseUser>).form;
    if (!bVar5) {
      Form::printErrors(&this_00->super_Form);
      goto LAB_001096a1;
    }
    iVar7 = (*(this_00->super_Form)._vptr_Form[1])();
    BaseUser::getFullName_abi_cxx11_(&local_140,(BaseUser *)CONCAT44(extraout_var,iVar7));
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x1212ef);
    psVar13 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1e0.field_2._M_allocated_capacity = *psVar13;
      local_1e0.field_2._8_8_ = plVar9[3];
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    }
    else {
      local_1e0.field_2._M_allocated_capacity = *psVar13;
      local_1e0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1e0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
    psVar13 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_200.field_2._M_allocated_capacity = *psVar13;
      local_200.field_2._8_8_ = puVar10[3];
      local_200._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_200.field_2._M_allocated_capacity = *psVar13;
      local_200._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_200._M_string_length = puVar10[1];
    *puVar10 = psVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_200._M_dataplus._M_p,local_200._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    pbVar3 = &local_140;
  }
  puVar2 = (undefined1 *)(&(pbVar3->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 != &pbVar3->field_2) {
    operator_delete(puVar2);
  }
LAB_001096a1:
  bVar5 = BaseUser::isAdmin(&local_120);
  if (bVar5) {
    pCVar11 = Controller::getInstance();
    local_200._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"admin-panel","");
    pVVar12 = Controller::getView(pCVar11,&local_200);
  }
  else {
    pCVar11 = Controller::getInstance();
    local_200._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"faculty-panel","");
    pVVar12 = Controller::getView(pCVar11,&local_200);
  }
  View::response->view = pVVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  return;
}

Assistant:

void UserUpdateView::display() {
    BaseUser loggedInUser = *Application::getInstance().getCurrentUser();
    cout << "To update a user fill in the details asked below: \n";
    string email, firstName, lastName, password;
    bool adminStatus;
    if (loggedInUser.isAdmin()) {
        cout << "Email: ";
        email = Input::getEmail();
    } else {
        email = loggedInUser.getEmail();
    }
    cout << "First name: ";
    firstName = Input::getString();
    cout << "Last name: ";
    lastName = Input::getString();
    cout << "Password: ";
    password = Input::getPassword();
    if (loggedInUser.isAdmin()) {
        cout << "Should this user be an admin? (y/n): ";
        adminStatus = (Input::getChar() == 'y');
    } else adminStatus = false;
    BaseUser *user = BaseUser::findByEmail(email);
    if (user) {
        form = new UserCreateUpdateForm(firstName, lastName, email, password, adminStatus, user);
        if (form->isValid()) {
            user = &form->save();
            cout << "User " + user->getFullName() + " updated successfully.\n";
        } else {
            form->printErrors();
        }
    } else {
        cout << "A user with " + email + " email address doesn't exist.\n";
    }
    response->view = loggedInUser.isAdmin() ? Controller::getInstance().getView("admin-panel")
                                            : Controller::getInstance().getView("faculty-panel");
}